

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

bool __thiscall
iDynTree::AttitudeQuaternionEKF::ekf_h
          (AttitudeQuaternionEKF *this,VectorDynSize *xhat_k_plus_one,VectorDynSize *zhat_k_plus_one
          )

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  VectorDynSize *in_RDX;
  long in_RDI;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double q1q2;
  double q0q3;
  double q3squared;
  double q2squared;
  double q1squared;
  double q0squared;
  double q0q1;
  double q2q3;
  double q0q2;
  double q1q3;
  UnitQuaternion q;
  DenseBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>_>
  *in_stack_fffffffffffffe58;
  Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffe60;
  Index in_stack_fffffffffffffe68;
  double dVar16;
  Index in_stack_fffffffffffffe70;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe78;
  VectorDynSize *vec;
  Scalar *other;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_> *this_00;
  VectorFixSize<4U> local_40;
  VectorDynSize *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  lVar8 = iDynTree::VectorDynSize::size();
  lVar9 = iDynTree::VectorDynSize::size();
  if (lVar8 == lVar9) {
    lVar8 = iDynTree::VectorDynSize::size();
    lVar9 = iDynTree::VectorDynSize::size();
    if (lVar8 == lVar9) {
      VectorFixSize<4U>::VectorFixSize(&local_40);
      toEigen((VectorDynSize *)in_stack_fffffffffffffe78);
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>::
      block<4,1>(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      toEigen<4U>((VectorFixSize<4U> *)in_stack_fffffffffffffe78);
      Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>::operator=
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,1);
      vec = (VectorDynSize *)*pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,3);
      dVar11 = (double)vec * *pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,0);
      dVar14 = *pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,2);
      dVar1 = *pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,2);
      other = (Scalar *)*pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,3);
      dVar12 = (double)other * *pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,0);
      this_00 = (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)*pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,1);
      dVar13 = (double)this_00 * *pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,0);
      dVar16 = *pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,0);
      dVar15 = *pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,1);
      dVar2 = *pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,1);
      dVar3 = *pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,2);
      dVar4 = *pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,2);
      dVar5 = *pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,3);
      dVar6 = *pdVar10;
      pdVar10 = VectorFixSize<4U>::operator()(&local_40,3);
      dVar7 = *pdVar10;
      pdVar10 = (double *)iDynTree::VectorDynSize::operator()(local_20,0);
      *pdVar10 = (dVar11 - dVar14 * dVar1) * -2.0;
      pdVar10 = (double *)iDynTree::VectorDynSize::operator()(local_20,1);
      *pdVar10 = (dVar12 + dVar13) * -2.0;
      pdVar10 = (double *)iDynTree::VectorDynSize::operator()(local_20,2);
      *pdVar10 = -(((dVar16 * dVar15 - dVar2 * dVar3) - dVar4 * dVar5) + dVar6 * dVar7);
      pdVar10 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0x4c0),2);
      if ((*pdVar10 != -1.0) || (NAN(*pdVar10))) {
        pdVar10 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0x4c0),2);
        if ((*pdVar10 != 1.0) || (NAN(*pdVar10))) {
          iDynTree::reportError
                    ("AttitudeQuaternionEKF","h",
                     "filter assumes gravity pointing upward or downward only");
          return false;
        }
        toEigen(vec);
        Eigen::
        DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
        operator*=(this_00,other);
      }
      if (*(long *)(in_RDI + 0x3e0) == 4) {
        pdVar10 = VectorFixSize<4U>::operator()(&local_40,0);
        dVar14 = *pdVar10;
        pdVar10 = VectorFixSize<4U>::operator()(&local_40,3);
        dVar1 = *pdVar10;
        pdVar10 = VectorFixSize<4U>::operator()(&local_40,1);
        dVar16 = *pdVar10;
        pdVar10 = VectorFixSize<4U>::operator()(&local_40,2);
        dVar15 = dVar4 * dVar5 + dVar6 * dVar7;
        dVar14 = atan2((dVar14 * dVar1 + dVar16 * *pdVar10) * 2.0,1.0 - (dVar15 + dVar15));
        pdVar10 = (double *)iDynTree::VectorDynSize::operator()(local_20,3);
        *pdVar10 = dVar14;
      }
      local_1 = true;
    }
    else {
      iDynTree::reportError("AttitudeQuaternionEKF","h","output size mismatch");
      local_1 = false;
    }
  }
  else {
    iDynTree::reportError("AttitudeQuaternionEKF","h","predicted state size mismatch");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekf_h(const iDynTree::VectorDynSize& xhat_k_plus_one, iDynTree::VectorDynSize& zhat_k_plus_one)
{
    if (xhat_k_plus_one.size() != m_x.size())
    {
        reportError("AttitudeQuaternionEKF", "h", "predicted state size mismatch");
        return false;
    }

    if (zhat_k_plus_one.size() != m_y.size())
    {
        reportError("AttitudeQuaternionEKF", "h", "output size mismatch");
        return false;
    }

    // following computation is the same as R^T e_3
    iDynTree::UnitQuaternion q;
    toEigen(q) = toEigen(xhat_k_plus_one).block<4,1>(0, 0);
    double q1q3{q(1)*q(3)};
    double q0q2{q(0)*q(2)};
    double q2q3{q(2)*q(3)};
    double q0q1{q(0)*q(1)};
    double q0squared{q(0)*q(0)};
    double q1squared{q(1)*q(1)};
    double q2squared{q(2)*q(2)};
    double q3squared{q(3)*q(3)};

    zhat_k_plus_one(0) = -2*(q1q3 - q0q2);
    zhat_k_plus_one(1) = -2*(q2q3 + q0q1);
    zhat_k_plus_one(2) = -(q0squared - q1squared - q2squared + q3squared);
    if (m_gravity_direction(2) == -1)
    {
        // have same zhat
    }
    else if (m_gravity_direction(2) == 1)
    {
        toEigen(zhat_k_plus_one) *= -1;
    }
    else
    {
        reportError("AttitudeQuaternionEKF", "h", "filter assumes gravity pointing upward or downward only");
        return false;
    }

    // magnetometer measurement gives us yaw
    if (m_output_size == output_dimensions_with_magnetometer)
    {
        double q0q3{q(0)*q(3)};
        double q1q2{q(1)*q(2)};
        zhat_k_plus_one(3) = std::atan2(2*(q0q3+q1q2), 1 - 2*(q2squared + q3squared));
    }

    return true;
}